

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::Texture2DGenMipmapCase::iterate(Texture2DGenMipmapCase *this)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  qpTestResult testResult;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  uint uVar6;
  ulong uVar7;
  int preferredHeight;
  long lVar8;
  RandomViewport viewport;
  BVec4 formatMask;
  IVec4 framebufferBits;
  IVec4 formatBits;
  vector<float,_std::allocator<float>_> texCoord;
  tcu local_a0 [16];
  IVec4 cmpBits;
  Texture2D resultTexture;
  long lVar5;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  uVar2 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar2 = this->m_width;
  }
  if (uVar2 == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  viewport.x = 8;
  viewport.y = 3;
  tcu::Texture2D::Texture2D
            (&resultTexture,(TextureFormat *)&viewport,(this->m_texture->m_refTexture).m_width,
             (this->m_texture->m_refTexture).m_height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,0);
  viewport.x = 0x3f800000;
  viewport.y = 0x3f000000;
  viewport.width = 0;
  viewport.height = 0x3f000000;
  framebufferBits.m_data[0] = 0;
  framebufferBits.m_data[1] = 0;
  framebufferBits.m_data[2] = 0x3f800000;
  framebufferBits.m_data[3] = 0x3f800000;
  tcu::fillWithGrid((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,8,(Vec4 *)&viewport,
                    (Vec4 *)&framebufferBits);
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x345);
  (**(code **)(lVar5 + 0xc18))(0x8192,this->m_hint);
  (**(code **)(lVar5 + 0x710))(0xde1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenerateMipmap()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x34a);
  viewport.x = 0;
  viewport.y = 0;
  framebufferBits.m_data[0] = 0x3f800000;
  framebufferBits.m_data[1] = 0x3f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,(Vec2 *)&viewport,(Vec2 *)&framebufferBits);
  lVar8 = 0;
  for (uVar7 = 0; 0x20 - uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = this->m_width >> ((byte)uVar7 & 0x1f);
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    preferredHeight = this->m_height >> ((byte)uVar7 & 0x1f);
    if (preferredHeight < 2) {
      preferredHeight = 1;
    }
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    dVar3 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
    deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
              (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar1,preferredHeight,
               dVar3 + (int)uVar7);
    (**(code **)(lVar5 + 0x1a00))(viewport._0_8_ & 0xffffffff,viewport.y,viewport.width);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,TEXTURETYPE_2D);
    tcu::Texture2D::allocLevel(&resultTexture,(int)uVar7);
    glu::readPixels(this->m_renderCtx,viewport.x,viewport.y,
                    (PixelBufferAccess *)
                    ((long)((resultTexture.super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8));
    lVar8 = lVar8 + 0x28;
  }
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  formatBits.m_data._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 8);
  formatBits.m_data._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 0x10);
  tcu::operator-((tcu *)&viewport,&formatBits,2);
  tcu::Vector<int,_4>::Vector(&cmpBits,0);
  tcu::max<int,4>((tcu *)&framebufferBits,(Vector<int,_4> *)&viewport,&cmpBits);
  viewport._0_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatBitDepth((tcu *)&formatBits,(TextureFormat *)&viewport);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&viewport,0);
  tcu::greaterThan<int,4>((tcu *)&formatMask,&formatBits,(Vector<int,_4> *)&viewport);
  tcu::min<int,4>((tcu *)&viewport,&framebufferBits,&formatBits);
  tcu::select<int,4>((tcu *)&cmpBits,(Vector<int,_4> *)&viewport,&framebufferBits,&formatMask);
  glu::TextureTestUtil::GenMipmapPrecision::GenMipmapPrecision((GenMipmapPrecision *)&viewport);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  glu::TextureTestUtil::getCompareMask((PixelFormat *)(CONCAT44(extraout_var_02,iVar1) + 8));
  tcu::computeFixedPointThreshold(local_a0,&cmpBits);
  viewport.x = 4;
  viewport.y = 4;
  viewport.width = 0;
  testResult = glu::TextureTestUtil::compareGenMipmapResult
                         (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,&resultTexture,
                          &this->m_texture->m_refTexture,(GenMipmapPrecision *)&viewport);
  if (testResult == QP_TEST_RESULT_PASS) {
    description = "Pass";
  }
  else if (testResult == QP_TEST_RESULT_QUALITY_WARNING) {
    description = "Low-quality method used";
  }
  else {
    description = glcts::fixed_sample_locations_values + 1;
    if (testResult == QP_TEST_RESULT_FAIL) {
      description = "Image comparison failed";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Texture3D::~Texture3D((Texture3D *)&resultTexture);
  return STOP;
}

Assistant:

Texture2DGenMipmapCase::IterateResult Texture2DGenMipmapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const deUint32			minFilter			= GL_NEAREST_MIPMAP_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;

	const int				numLevels			= deLog2Floor32(de::max(m_width, m_height))+1;

	tcu::Texture2D			resultTexture		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight());

	vector<float>			texCoord;

	// Initialize texture level 0 with colored grid.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 8, tcu::Vec4(1.0f, 0.5f, 0.0f, 0.5f), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	// Upload data and setup params.
	m_texture->upload();

	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Generate mipmap.
	gl.hint(GL_GENERATE_MIPMAP_HINT, m_hint);
	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap()");

	// Use (0, 0) -> (1, 1) texture coordinates.
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	// Fetch resulting texture by rendering.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const int				levelWidth		= de::max(1, m_width >> levelNdx);
		const int				levelHeight		= de::max(1, m_height >> levelNdx);
		const RandomViewport	viewport		(m_renderCtx.getRenderTarget(), levelWidth, levelHeight, deStringHash(getName()) + levelNdx);

		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
		m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);

		resultTexture.allocLevel(levelNdx);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resultTexture.getLevel(levelNdx));
	}

	// Compare results
	{

		const IVec4			framebufferBits		= max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0));
		const IVec4			formatBits			= tcu::getTextureFormatBitDepth(glu::mapGLTransferFormat(m_format, m_dataType));
		const tcu::BVec4	formatMask			= greaterThan(formatBits, IVec4(0));
		const IVec4			cmpBits				= select(min(framebufferBits, formatBits), framebufferBits, formatMask);
		GenMipmapPrecision	comparePrec;

		comparePrec.colorMask		= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		comparePrec.colorThreshold	= tcu::computeFixedPointThreshold(cmpBits);
		comparePrec.filterBits		= tcu::IVec3(4, 4, 0);

		const qpTestResult compareResult = compareGenMipmapResult(m_testCtx.getLog(), resultTexture, m_texture->getRefTexture(), comparePrec);

		m_testCtx.setTestResult(compareResult, compareResult == QP_TEST_RESULT_PASS				? "Pass" :
											   compareResult == QP_TEST_RESULT_QUALITY_WARNING	? "Low-quality method used"	:
											   compareResult == QP_TEST_RESULT_FAIL				? "Image comparison failed"	: "");
	}

	return STOP;
}